

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

void __thiscall
ON_Xform::Rotation(ON_Xform *this,ON_3dVector *X0,ON_3dVector *Y0,ON_3dVector *Z0,ON_3dVector *X1,
                  ON_3dVector *Y1,ON_3dVector *Z1)

{
  long lVar1;
  ON_Xform *pOVar2;
  byte bVar3;
  ON_Xform F1;
  ON_Xform F0;
  ON_Xform local_1b0;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  bVar3 = 0;
  ON_Xform(&local_b0);
  local_b0.m_xform[0][0] = X0->x;
  local_b0.m_xform[0][1] = X0->y;
  local_b0.m_xform[0][2] = X0->z;
  local_b0.m_xform[1][0] = Y0->x;
  local_b0.m_xform[1][1] = Y0->y;
  local_b0.m_xform[1][2] = Y0->z;
  local_b0.m_xform[2][0] = Z0->x;
  local_b0.m_xform[2][1] = Z0->y;
  local_b0.m_xform[2][2] = Z0->z;
  local_b0.m_xform[3][3] = 1.0;
  ON_Xform(&local_130);
  local_130.m_xform[0][0] = X1->x;
  local_130.m_xform[0][1] = Y1->x;
  local_130.m_xform[0][2] = Z1->x;
  local_130.m_xform[1][0] = X1->y;
  local_130.m_xform[1][1] = Y1->y;
  local_130.m_xform[1][2] = Z1->y;
  local_130.m_xform[2][0] = X1->z;
  local_130.m_xform[2][1] = Y1->z;
  local_130.m_xform[2][2] = Z1->z;
  local_130.m_xform[3][3] = 1.0;
  operator*(&local_1b0,&local_130,&local_b0);
  pOVar2 = &local_1b0;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    this->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar3 * -2 + 1) * 8);
    this = (ON_Xform *)((long)this + ((ulong)bVar3 * -2 + 1) * 8);
  }
  return;
}

Assistant:

void ON_Xform::Rotation(
  const ON_3dVector&  X0, // initial frame X (X,Y,Z = right handed orthonormal frame)
  const ON_3dVector&  Y0, // initial frame Y
  const ON_3dVector&  Z0, // initial frame Z
  const ON_3dVector&  X1, // final frame X (X,Y,Z = another right handed orthonormal frame)
  const ON_3dVector&  Y1, // final frame Y
  const ON_3dVector&  Z1  // final frame Z
  )
{
  // transformation maps X0 to X1, Y0 to Y1, Z0 to Z1

  // F0 changes x0,y0,z0 to world X,Y,Z
  ON_Xform F0;
  F0[0][0] = X0.x; F0[0][1] = X0.y; F0[0][2] = X0.z;
  F0[1][0] = Y0.x; F0[1][1] = Y0.y; F0[1][2] = Y0.z;
  F0[2][0] = Z0.x; F0[2][1] = Z0.y; F0[2][2] = Z0.z;
  F0[3][3] = 1.0;

  // F1 changes world X,Y,Z to x1,y1,z1
  ON_Xform F1;
  F1[0][0] = X1.x; F1[0][1] = Y1.x; F1[0][2] = Z1.x;
  F1[1][0] = X1.y; F1[1][1] = Y1.y; F1[1][2] = Z1.y;
  F1[2][0] = X1.z; F1[2][1] = Y1.z; F1[2][2] = Z1.z;
  F1[3][3] = 1.0;

  *this = F1*F0;
}